

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O0

int compare_motions(void *arg_a,void *arg_b)

{
  RANSAC_MOTION *motion_b;
  RANSAC_MOTION *motion_a;
  void *arg_b_local;
  void *arg_a_local;
  undefined4 local_4;
  
  if (*arg_b < *arg_a) {
    local_4 = -1;
  }
  else if (*arg_a < *arg_b) {
    local_4 = 1;
  }
  else if (*(double *)((long)arg_b + 8) <= *(double *)((long)arg_a + 8)) {
    if (*(double *)((long)arg_a + 8) < *(double *)((long)arg_b + 8) ||
        *(double *)((long)arg_a + 8) == *(double *)((long)arg_b + 8)) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int compare_motions(const void *arg_a, const void *arg_b) {
  const RANSAC_MOTION *motion_a = (RANSAC_MOTION *)arg_a;
  const RANSAC_MOTION *motion_b = (RANSAC_MOTION *)arg_b;

  if (motion_a->num_inliers > motion_b->num_inliers) return -1;
  if (motion_a->num_inliers < motion_b->num_inliers) return 1;
  if (motion_a->sse < motion_b->sse) return -1;
  if (motion_a->sse > motion_b->sse) return 1;
  return 0;
}